

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common_avl.c
# Opt level: O0

void do_tests(_Bool do_random)

{
  char *pcVar1;
  _Bool do_random_local;
  
  pcVar1 = "non ";
  if (do_random) {
    pcVar1 = "";
  }
  printf("Do %srandom tests.\n",pcVar1);
  test_insert_nondup(do_random);
  test_insert_dup(do_random);
  test_find(do_random);
  test_delete_nondup(do_random);
  test_delete_dup(do_random);
  test_greaterequal(do_random);
  test_lessequal(do_random);
  test_conditions(do_random);
  test_element_functions(do_random);
  test_for_each_macros(do_random);
  test_for_each_reverse_macros(do_random);
  test_for_each_save_macro(do_random);
  test_for_each_reverse_save_macro(do_random);
  test_remove_all_macro(do_random);
  return;
}

Assistant:

static void do_tests(bool do_random) {
  printf("Do %srandom tests.\n", do_random ? "" : "non ");

  test_insert_nondup(do_random);
  test_insert_dup(do_random);
  test_find(do_random);
  test_delete_nondup(do_random);
  test_delete_dup(do_random);
  test_greaterequal(do_random);
  test_lessequal(do_random);
  test_conditions(do_random);
  test_element_functions(do_random);
  test_for_each_macros(do_random);
  test_for_each_reverse_macros(do_random);
  test_for_each_save_macro(do_random);
  test_for_each_reverse_save_macro(do_random);
  test_remove_all_macro(do_random);
}